

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigINI::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigINI *this,istream *input)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  size_type this_00;
  bool bVar1;
  istream *piVar2;
  char *pcVar3;
  long lVar4;
  reference pvVar5;
  iterator __first;
  iterator __last;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  const_iterator local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_288;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_280;
  const_iterator local_278;
  undefined1 local_270 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  plist;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  iterator local_230;
  size_type local_228;
  string local_220;
  string local_200;
  undefined1 local_1da;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  iterator local_1b0;
  size_type local_1a8;
  string local_1a0;
  string local_180;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  string local_148;
  undefined1 local_128 [8];
  string item;
  string local_e8;
  long local_c8;
  size_type pos;
  ConfigItem *out;
  ulong local_98;
  size_t len;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  allocator<char> local_61;
  string local_60 [8];
  string section;
  string line;
  istream *input_local;
  ConfigINI *this_local;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  
  ::std::__cxx11::string::string((string *)(section.field_2._M_local_buf + 8));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>(local_60,"default",&local_61);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_61);
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::vector(__return_storage_ptr__);
  while( true ) {
    piVar2 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)input,(string *)(section.field_2._M_local_buf + 8));
    bVar1 = ::std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&len);
    detail::trim((string *)((long)&section.field_2 + 8));
    local_98 = ::std::__cxx11::string::length();
    if (((local_98 < 2) ||
        (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
        *pcVar3 != '[')) ||
       (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
       *pcVar3 != ']')) {
      if ((local_98 != 0) &&
         (pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)((long)&section.field_2 + 8)),
         *pcVar3 != ';')) {
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  (__return_storage_ptr__);
        pos = (size_type)
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::back
                        (__return_storage_ptr__);
        local_c8 = ::std::__cxx11::string::find((char)&section + '\x18',0x3d);
        if (local_c8 == -1) {
          detail::trim_copy(&local_1a0,(string *)((long)&section.field_2 + 8));
          ::std::__cxx11::string::operator=((string *)(pos + 0x18),(string *)&local_1a0);
          ::std::__cxx11::string::~string((string *)&local_1a0);
          local_1da = 1;
          local_1d8 = &local_1d0;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"ON",&local_1d9)
          ;
          local_1da = 0;
          local_1b0 = &local_1d0;
          local_1a8 = 1;
          __l_00._M_len = 1;
          __l_00._M_array = local_1b0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&len,__l_00);
          local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1b0;
          do {
            local_328 = local_328 + -1;
            ::std::__cxx11::string::~string((string *)local_328);
          } while (local_328 != &local_1d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
        }
        else {
          ::std::__cxx11::string::substr
                    ((ulong)((long)&item.field_2 + 8),(ulong)((long)&section.field_2 + 8));
          detail::trim_copy(&local_e8,(string *)((long)&item.field_2 + 8));
          ::std::__cxx11::string::operator=((string *)(pos + 0x18),(string *)&local_e8);
          ::std::__cxx11::string::~string((string *)&local_e8);
          ::std::__cxx11::string::~string((string *)(item.field_2._M_local_buf + 8));
          ::std::__cxx11::string::substr((ulong)&local_148,(ulong)((long)&section.field_2 + 8));
          detail::trim_copy((string *)local_128,&local_148);
          ::std::__cxx11::string::~string((string *)&local_148);
          ::std::__cxx11::string::string((string *)&local_180,(string *)local_128);
          detail::split_up(&local_160,&local_180);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&len,&local_160);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_160);
          ::std::__cxx11::string::~string((string *)&local_180);
          ::std::__cxx11::string::~string((string *)local_128);
        }
        ::std::__cxx11::string::string((string *)&local_220,local_60);
        detail::to_lower(&local_200,&local_220);
        bVar1 = ::std::operator!=(&local_200,"default");
        ::std::__cxx11::string::~string((string *)&local_200);
        ::std::__cxx11::string::~string((string *)&local_220);
        if (bVar1) {
          plist.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = &local_250;
          ::std::__cxx11::string::string
                    ((string *)
                     plist.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_60);
          local_230 = &local_250;
          local_228 = 1;
          __l._M_len = 1;
          __l._M_array = local_230;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)pos,__l);
          local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_230;
          do {
            local_370 = local_370 + -1;
            ::std::__cxx11::string::~string((string *)local_370);
          } while (local_370 != &local_250);
        }
        lVar4 = ::std::__cxx11::string::find((char)pos + '\x18',0x2e);
        if (lVar4 != -1) {
          detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_270,(string *)(pos + 0x18),'.');
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_270);
          ::std::__cxx11::string::operator=((string *)(pos + 0x18),(string *)pvVar5);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_270);
          this_00 = pos;
          local_280._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)pos);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_278,&local_280);
          local_288._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_270);
          local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_270);
          local_298 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)this_00,local_278,local_288,
                                 (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_290);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_270);
        }
        this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(pos + 0x38);
        local_2a8._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_01);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_2a0,&local_2a8);
        __first = ::std::
                  begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&len);
        __last = ::std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                           ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&len);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  (this_01,local_2a0,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__first._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )__last._M_current);
      }
    }
    else {
      ::std::__cxx11::string::substr((ulong)&out,(ulong)((long)&section.field_2 + 8));
      ::std::__cxx11::string::operator=(local_60,(string *)&out);
      ::std::__cxx11::string::~string((string *)&out);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&len);
  }
  items.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
  ::std::__cxx11::string::~string(local_60);
  ::std::__cxx11::string::~string((string *)(section.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<ConfigItem> from_config(std::istream &input) const override {
        std::string line;
        std::string section = "default";

        std::vector<ConfigItem> output;

        while(getline(input, line)) {
            std::vector<std::string> items;

            detail::trim(line);
            size_t len = line.length();
            if(len > 1 && line[0] == '[' && line[len - 1] == ']') {
                section = line.substr(1, len - 2);
            } else if(len > 0 && line[0] != ';') {
                output.emplace_back();
                ConfigItem &out = output.back();

                // Find = in string, split and recombine
                auto pos = line.find('=');
                if(pos != std::string::npos) {
                    out.name = detail::trim_copy(line.substr(0, pos));
                    std::string item = detail::trim_copy(line.substr(pos + 1));
                    items = detail::split_up(item);
                } else {
                    out.name = detail::trim_copy(line);
                    items = {"ON"};
                }

                if(detail::to_lower(section) != "default") {
                    out.parents = {section};
                }

                if(out.name.find('.') != std::string::npos) {
                    std::vector<std::string> plist = detail::split(out.name, '.');
                    out.name = plist.back();
                    plist.pop_back();
                    out.parents.insert(out.parents.end(), plist.begin(), plist.end());
                }

                out.inputs.insert(std::end(out.inputs), std::begin(items), std::end(items));
            }
        }
        return output;
    }